

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_psbt.cpp
# Opt level: O0

uint32_t __thiscall
cfd::Psbt::AddTxOutData
          (Psbt *this,Amount *amount,Address *address,Script *redeem_script,
          vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *key_list)

{
  uint32_t index_00;
  Script *in_RCX;
  Address *in_RDX;
  Amount *in_RSI;
  Psbt *in_RDI;
  vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *in_R8;
  wally_psbt *psbt_pointer;
  CfdException *except;
  uint32_t index;
  Script local_68;
  uint32_t local_2c;
  vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *local_28;
  Script *local_20;
  Amount *local_10;
  
  local_28 = in_R8;
  local_20 = in_RCX;
  local_10 = in_RSI;
  core::Address::GetLockingScript(&local_68,in_RDX);
  index_00 = core::Psbt::AddTxOut(in_RDI,&local_68,local_10);
  core::Script::~Script((Script *)in_RDI);
  local_2c = index_00;
  core::Psbt::SetTxOutData(in_RDI,index_00,local_20,local_28);
  return 0;
}

Assistant:

uint32_t Psbt::AddTxOutData(
    const Amount& amount, const Address& address, const Script& redeem_script,
    const std::vector<KeyData>& key_list) {
  uint32_t index =
      cfd::core::Psbt::AddTxOut(address.GetLockingScript(), amount);
  try {
    SetTxOutData(index, redeem_script, key_list);
  } catch (const CfdException& except) {
    struct wally_psbt* psbt_pointer;
    psbt_pointer = static_cast<struct wally_psbt*>(wally_psbt_pointer_);
    wally_psbt_remove_output(psbt_pointer, index);
    base_tx_ = cfd::core::Psbt::RebuildTransaction(wally_psbt_pointer_);
    throw except;
  }
  return 0;
}